

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nullc.cpp
# Opt level: O0

nullres nullcRunFunctionInternal(uint functionID,char *argBuf)

{
  bool bVar1;
  bool local_19;
  nullres good;
  char *argBuf_local;
  uint functionID_local;
  
  if ((NULLC::initialized & 1) == 0) {
    NULLC::nullcLastError = "ERROR: NULLC is not initialized";
    argBuf_local._7_1_ = false;
  }
  else {
    if (NULLC::currExec == 1) {
      bVar1 = ExecutorX86::Run(NULLC::executorX86,functionID,argBuf);
      if (!bVar1) {
        NULLC::nullcLastError = ExecutorX86::GetErrorMessage(NULLC::executorX86);
      }
      local_19 = bVar1;
    }
    else if (NULLC::currExec == 2) {
      local_19 = false;
      NULLC::nullcLastError = "LLVM execution engine is not available";
    }
    else if (NULLC::currExec == 0) {
      bVar1 = ExecutorRegVm::Run(NULLC::executorRegVm,functionID,argBuf);
      if (!bVar1) {
        NULLC::nullcLastError = ExecutorRegVm::GetErrorMessage(NULLC::executorRegVm);
      }
      local_19 = bVar1;
    }
    else {
      local_19 = false;
      NULLC::nullcLastError = "Unknown executor code";
    }
    argBuf_local._7_1_ = local_19;
  }
  return argBuf_local._7_1_;
}

Assistant:

nullres nullcRunFunctionInternal(unsigned functionID, const char* argBuf)
{
	using namespace NULLC;
	NULLC_CHECK_INITIALIZED(false);

	nullres good = true;

	if(currExec == NULLC_X86)
	{
#ifdef NULLC_BUILD_X86_JIT
		if(!executorX86->Run(functionID, argBuf))
		{
			good = false;
			nullcLastError = executorX86->GetErrorMessage();
		}
#else
		good = false;
		nullcLastError = "X86 JIT execution engine is not available";
#endif
	}
	else if(currExec == NULLC_LLVM)
	{
#if defined(NULLC_LLVM_SUPPORT) && !defined(NULLC_NO_EXECUTOR)
		if(!executorLLVM->Run(functionID, argBuf))
		{
			good = false;
			nullcLastError = executorLLVM->GetErrorMessage();
		}
#else
		good = false;
		nullcLastError = "LLVM execution engine is not available";
#endif
	}
	else if(currExec == NULLC_REG_VM)
	{
#ifndef NULLC_NO_EXECUTOR
		if(!executorRegVm->Run(functionID, argBuf))
		{
			good = false;
			nullcLastError = executorRegVm->GetErrorMessage();
		}
#else
		good = false;
		nullcLastError = "VM execution engine is not available";
#endif
	}
	else
	{
		(void)functionID;
		(void)argBuf;

		good = false;
		nullcLastError = "Unknown executor code";
	}

#if !defined(NULLC_NO_EXECUTOR) && defined(NULLC_REG_VM_PROFILE_INSTRUCTIONS)
	if(currExec == NULLC_REG_VM && functionID == ~0u && enableLogFiles)
	{
		OutputContext outputCtx;

		outputCtx.openStream = openStream;
		outputCtx.writeStream = writeStream;
		outputCtx.closeStream = closeStream;

		outputCtx.outputBuf = outputBuf;
		outputCtx.outputBufSize = NULLC_OUTPUT_BUFFER_SIZE;

		outputCtx.tempBuf = tempOutputBuf;
		outputCtx.tempBufSize = NULLC_TEMP_OUTPUT_BUFFER_SIZE;

		outputCtx.stream = outputCtx.openStream("link_reg_vm_exec.txt");

		if(outputCtx.stream)
		{
			linker->SaveRegVmListing(outputCtx, true);

			outputCtx.closeStream(outputCtx.stream);
			outputCtx.stream = NULL;
		}
	}
#endif

	return good;
}